

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmAndisr<(moira::Instr)91,(moira::Mode)11,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Ims<2> local_40;
  int local_3c;
  Imu<4> local_34;
  int local_30;
  u32 local_28;
  u16 local_22;
  u32 src;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  local_22 = op;
  _src = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  local_28 = dasmIncRead<2>(this,addr);
  if (**(int **)(addr_local + 0xc) == 4) {
    pSVar1 = StrWriter::operator<<((StrWriter *)addr_local);
    local_30 = addr_local[0xe];
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_30);
    Imu<4>::Imu(&local_34,local_28);
    pSVar1 = StrWriter::operator<<(pSVar1,local_34);
    pSVar1 = StrWriter::operator<<(pSVar1);
    StrWriter::operator<<(pSVar1);
  }
  else {
    pSVar1 = StrWriter::operator<<((StrWriter *)addr_local);
    pSVar1 = StrWriter::operator<<(pSVar1);
    local_3c = addr_local[0xe];
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_3c);
    Ims<2>::Ims(&local_40,local_28);
    pSVar1 = StrWriter::operator<<(pSVar1,local_40);
    pSVar1 = StrWriter::operator<<(pSVar1);
    StrWriter::operator<<(pSVar1);
  }
  return;
}

Assistant:

void
Moira::dasmAndisr(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);

    if (str.style.syntax == Syntax::MUSASHI) {
        str << Ins<I>{} << str.tab << Imu{src} << Sep{} << Sr{};
    } else {
        str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(src) << Sep{} << Sr{};
    }
}